

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Instrument::Instrument(Instrument *this,ISMSnoop *ismsnoop,string *path)

{
  ISMSnoop *this_00;
  bool bVar1;
  char *__args;
  ISMSnoopInstrument *pIVar2;
  ExpressionLhs<ISMSnoopInstrument_*const_&> EVar3;
  ExpressionLhs<ISMSnoopInstrument_*const_&> local_308 [2];
  SourceLineInfo local_2e8;
  undefined1 local_2c0 [8];
  ResultBuilder __catchResult;
  string *path_local;
  ISMSnoop *ismsnoop_local;
  Instrument *this_local;
  
  this->ismsnoop_ = ismsnoop;
  this_00 = this->ismsnoop_;
  __catchResult._664_8_ = path;
  __args = (char *)std::__cxx11::string::c_str();
  pIVar2 = std::function<ISMSnoopInstrument_*(const_char_*)>::operator()(&this_00->open,__args);
  this->instrument_ = pIVar2;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Penhorse[P]ismsnoop/test/src/main.cpp"
               ,0x47);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2c0,"REQUIRE",&local_2e8,"instrument_",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_2e8);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_2c0,&this->instrument_);
    local_308[0] = EVar3;
    Catch::ExpressionLhs<ISMSnoopInstrument_*const_&>::endExpression(local_308);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2c0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2c0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2c0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

Instrument::Instrument(const ISMSnoop & ismsnoop, const std::string & path)
	: ismsnoop_(&ismsnoop)
	, instrument_(ismsnoop_->open(path.c_str()))
{
	REQUIRE(instrument_);
}